

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.h
# Opt level: O0

imath_half_bits_t imath_float_to_half(float f)

{
  byte bVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint32_t shift;
  uint32_t r;
  uint32_t ui;
  uint32_t m;
  uint32_t e;
  imath_half_bits_t ret;
  imath_half_uif_t v;
  float f_local;
  ushort local_2;
  
  fVar2 = ABS(f);
  local_2 = (ushort)((uint)f >> 0x10) & 0x8000;
  if ((uint)fVar2 < 0x38800000) {
    if (0x33000000 < (uint)fVar2) {
      bVar1 = 0x7e - (char)((uint)fVar2 >> 0x17);
      uVar4 = (uint)f & 0x7fffff | 0x800000;
      uVar3 = uVar4 << (0x20 - bVar1 & 0x1f);
      uVar4 = uVar4 >> (bVar1 & 0x1f);
      ret = local_2 | (ushort)uVar4;
      if ((0x80000000 < uVar3) || ((uVar3 == 0x80000000 && ((uVar4 & 1) != 0)))) {
        ret = ret + 1;
      }
      local_2 = ret;
    }
  }
  else if ((uint)fVar2 < 0x7f800000) {
    if ((uint)fVar2 < 0x477ff000) {
      local_2 = local_2 | (ushort)((int)fVar2 + 0xc8000fffU + ((int)fVar2 + 0xc8000000U >> 0xd & 1)
                                  >> 0xd);
    }
    else {
      local_2 = local_2 | 0x7c00;
    }
  }
  else {
    local_2 = local_2 | 0x7c00;
    if (fVar2 != INFINITY) {
      uVar3 = ((uint)f & 0x7fffff) >> 0xd;
      local_2 = local_2 | (ushort)uVar3 | (ushort)(uVar3 == 0);
    }
  }
  return local_2;
}

Assistant:

static inline imath_half_bits_t
imath_float_to_half (float f)
{
#if defined(__F16C__)
#    ifdef _MSC_VER
    // msvc does not seem to have cvtsh_ss :(
    return _mm_extract_epi16 (
        _mm_cvtps_ph (
            _mm_set_ss (f), (_MM_FROUND_TO_NEAREST_INT)),
        0);
#    else
    // preserve the fixed rounding mode to nearest
    return _cvtss_sh (f, (_MM_FROUND_TO_NEAREST_INT | _MM_FROUND_NO_EXC));
#    endif
#else
    imath_half_uif_t  v;
    imath_half_bits_t ret;
    uint32_t          e, m, ui, r, shift;

    v.f = f;

    ui  = (v.i & ~0x80000000);
    ret = ((v.i >> 16) & 0x8000);

    // exponent large enough to result in a normal number, round and return
    if (ui >= 0x38800000)
    {
        // inf or nan
        if (IMATH_UNLIKELY (ui >= 0x7f800000))
        {
            ret |= 0x7c00;
            if (ui == 0x7f800000) return ret;
            m = (ui & 0x7fffff) >> 13;
            // make sure we have at least one bit after shift to preserve nan-ness
            return ret | (uint16_t) m | (uint16_t) (m == 0);
        }

        // too large, round to infinity
        if (IMATH_UNLIKELY (ui > 0x477fefff))
        {
#    ifdef IMATH_HALF_ENABLE_FP_EXCEPTIONS
            feraiseexcept (FE_OVERFLOW);
#    endif
            return ret | 0x7c00;
        }

        ui -= 0x38000000;
        ui = ((ui + 0x00000fff + ((ui >> 13) & 1)) >> 13);
        return ret | (uint16_t) ui;
    }

    // zero or flush to 0
    if (ui < 0x33000001)
    {
#    ifdef IMATH_HALF_ENABLE_FP_EXCEPTIONS
        if (ui == 0) return ret;
        feraiseexcept (FE_UNDERFLOW);
#    endif
        return ret;
    }

    // produce a denormalized half
    e     = (ui >> 23);
    shift = 0x7e - e;
    m     = 0x800000 | (ui & 0x7fffff);
    r     = m << (32 - shift);
    ret |= (m >> shift);
    if (r > 0x80000000 || (r == 0x80000000 && (ret & 0x1) != 0)) ++ret;
    return ret;
#endif
}